

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

PStruct * NewStruct(FName *name,DObject *outer)

{
  int iVar1;
  size_t in_RAX;
  PStruct *this;
  size_t bucket;
  size_t local_28;
  
  local_28 = in_RAX;
  this = (PStruct *)
         FTypeTable::FindType
                   (&TypeTable,PStruct::RegistrationInfo.MyClass,(intptr_t)outer,(long)name->Index,
                    &local_28);
  if (this == (PStruct *)0x0) {
    this = (PStruct *)
           M_Malloc_Dbg(0xa0,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobject.h"
                        ,0x1f7);
    iVar1 = name->Index;
    PType::PType((PType *)this);
    (this->super_PNamedType).Outer = outer;
    (this->super_PNamedType).TypeName.Index = iVar1;
    (this->super_PNamedType).super_PCompoundType.super_PType.super_DObject._vptr_DObject =
         (_func_int **)&PTR_StaticType_00847108;
    (this->Fields).Array = (PField **)0x0;
    (this->Fields).Most = 0;
    (this->Fields).Count = 0;
    FTypeTable::AddType(&TypeTable,(PType *)this,PStruct::RegistrationInfo.MyClass,(intptr_t)outer,
                        (long)name->Index,local_28);
  }
  return this;
}

Assistant:

PStruct *NewStruct(FName name, DObject *outer)
{
	size_t bucket;
	PType *stype = TypeTable.FindType(RUNTIME_CLASS(PStruct), (intptr_t)outer, (intptr_t)name, &bucket);
	if (stype == NULL)
	{
		stype = new PStruct(name, outer);
		TypeTable.AddType(stype, RUNTIME_CLASS(PStruct), (intptr_t)outer, (intptr_t)name, bucket);
	}
	return static_cast<PStruct *>(stype);
}